

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderInvarianceBaseTest::getVSCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderInvarianceBaseTest *this,
          uint n_iteration)

{
  allocator<char> local_1e;
  undefined1 local_1d;
  uint local_1c;
  TessellationShaderInvarianceBaseTest *pTStack_18;
  uint n_iteration_local;
  TessellationShaderInvarianceBaseTest *this_local;
  string *result;
  
  local_1d = 0;
  local_1c = n_iteration;
  pTStack_18 = this;
  this_local = (TessellationShaderInvarianceBaseTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\nvoid main()\n{\n    gl_Position = vec4(1.0, 2.0, 3.0, 0.0);\n}\n",
             &local_1e);
  std::allocator<char>::~allocator(&local_1e);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderInvarianceBaseTest::getVSCode(unsigned int n_iteration)
{
	DE_UNREF(n_iteration);

	std::string result = "${VERSION}\n"
						 "\n"
						 "void main()\n"
						 "{\n"
						 "    gl_Position = vec4(1.0, 2.0, 3.0, 0.0);\n"
						 "}\n";

	return result;
}